

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

base_learner * Search::setup(options_i *options,vw *all)

{
  size_t *location;
  size_t *location_00;
  uint32_t *location_01;
  uint uVar1;
  search_private *psVar2;
  options_i *poVar3;
  search_task *psVar4;
  search_metatask *psVar5;
  _func_void_search_ptr_size_t_ptr_options_i_ptr *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  typed_option<unsigned_long> *ptVar12;
  typed_option<float> *ptVar13;
  vw_exception *pvVar14;
  polylabel *ppVar15;
  undefined **ppuVar16;
  ostream *poVar17;
  typed_option<unsigned_int> *ptVar18;
  base_learner *base;
  clock_t cVar19;
  size_t sVar20;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar21;
  long lVar22;
  label_parser *plVar23;
  search_task **mytask_2;
  RollMethod RVar24;
  byte bVar25;
  search_task **mytask;
  byte bVar26;
  float fVar27;
  string sStack_14c8;
  vw *local_14a8;
  allocator local_149d;
  allocator local_149c;
  allocator local_149b;
  allocator local_149a;
  allocator local_1499;
  allocator local_1498 [32];
  allocator local_1478 [32];
  free_ptr<search> sch;
  stringstream __msg;
  undefined1 local_1430 [96];
  bool local_13d0;
  option_group_definition new_options;
  string rollout_string;
  string rollin_string;
  string task_string;
  uint32_t search_trained_nb_policies;
  string interpolation_string;
  string metatask_string;
  string search_allowed_transitions;
  string neighbor_features_string;
  string local_1190 [32];
  string local_1170;
  string local_1150;
  string local_1130;
  string local_1110;
  string local_10f0;
  string local_10d0;
  string local_10b0;
  string local_1090;
  string local_1070;
  string local_1050;
  string local_1030;
  string local_1010;
  string local_ff0;
  string local_fd0;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  typed_option<unsigned_long> local_df0;
  typed_option<float> local_d50;
  typed_option<bool> local_cb0;
  typed_option<float> local_c10;
  typed_option<bool> local_b70;
  typed_option<bool> local_ad0;
  typed_option<unsigned_long> local_a30;
  typed_option<unsigned_long> local_990;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f0;
  typed_option<float> local_850;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b0;
  typed_option<unsigned_int> local_710;
  typed_option<unsigned_int> local_670;
  typed_option<float> local_5d0;
  typed_option<float> local_530;
  typed_option<unsigned_long> local_490;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar26 = 0;
  local_14a8 = all;
  scoped_calloc_or_throw<Search::search>();
  psVar2 = (sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_Search::search_*,_false>._M_head_impl)->priv;
  task_string._M_dataplus._M_p = (pointer)&task_string.field_2;
  task_string._M_string_length = 0;
  task_string.field_2._M_local_buf[0] = '\0';
  metatask_string._M_dataplus._M_p = (pointer)&metatask_string.field_2;
  metatask_string._M_string_length = 0;
  metatask_string.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&interpolation_string,"data",(allocator *)&__msg);
  neighbor_features_string._M_dataplus._M_p = (pointer)&neighbor_features_string.field_2;
  neighbor_features_string._M_string_length = 0;
  neighbor_features_string.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&rollout_string,"mix_per_state",(allocator *)&__msg);
  std::__cxx11::string::string((string *)&rollin_string,"mix_per_state",(allocator *)&__msg);
  search_allowed_transitions._M_dataplus._M_p = (pointer)&search_allowed_transitions.field_2;
  search_allowed_transitions._M_string_length = 0;
  search_allowed_transitions.field_2._M_local_buf[0] = '\0';
  psVar2->A = 1;
  std::__cxx11::string::string((string *)&local_eb0,"Search options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_eb0);
  std::__cxx11::string::~string((string *)&local_eb0);
  std::__cxx11::string::string((string *)&local_ed0,"search",local_1498);
  location = &psVar2->A;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_ed0,location);
  local_13d0 = true;
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "Use learning to search, argument=maximum action id or 0 for LDF",local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,(typed_option<unsigned_long> *)&__msg);
  VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_d0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_d0);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_ed0);
  std::__cxx11::string::string((string *)&local_ef0,"search_task",local_1498);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_ef0,&task_string);
  local_13d0 = true;
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "the search task (use \"--search_task list\" to get a list of available tasks)",
             local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&new_options,&local_170);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_170);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::__cxx11::string::string((string *)&local_f10,"search_metatask",local_1498);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_f10,&metatask_string);
  local_13d0 = true;
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"
             ,local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_210,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&new_options,&local_210);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_210);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_f10);
  std::__cxx11::string::string((string *)&local_f30,"search_interpolation",local_1498);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_f30,&interpolation_string);
  local_13d0 = true;
  std::__cxx11::string::string
            ((string *)&sStack_14c8,"at what level should interpolation happen? [*data|policy]",
             local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_2b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&new_options,&local_2b0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_2b0);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_f30);
  std::__cxx11::string::string((string *)&local_f50,"search_rollout",local_1498);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_f50,&rollout_string);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"
             ,local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_350,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&new_options,&local_350);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_350);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_f50);
  std::__cxx11::string::string((string *)&local_f70,"search_rollin",local_1498);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_f70,&rollin_string);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"
             ,local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_3f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&new_options,&local_3f0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_3f0);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::string((string *)&local_f90,"search_passes_per_policy",local_1498);
  location_00 = &psVar2->passes_per_policy;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_f90,location_00);
  ptVar12 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)&__msg,1);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "number of passes per policy (only valid for search_interpolation=policy)",local_1478);
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_490,ptVar12);
  VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_490);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_490);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_f90);
  std::__cxx11::string::string((string *)&local_fb0,"search_beta",local_1498);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_fb0,&psVar2->beta);
  ptVar13 = VW::config::typed_option<float>::default_value((typed_option<float> *)&__msg,0.5);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "interpolation rate for policies (only valid for search_interpolation=policy)",
             local_1478);
  std::__cxx11::string::_M_assign((string *)&(ptVar13->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_530,ptVar13);
  VW::config::option_group_definition::add<float>(&new_options,&local_530);
  VW::config::typed_option<float>::~typed_option(&local_530);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_fb0);
  std::__cxx11::string::string((string *)&local_fd0,"search_alpha",local_1498);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_fd0,&psVar2->alpha);
  ptVar13 = VW::config::typed_option<float>::default_value((typed_option<float> *)&__msg,1e-10);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)",local_1478);
  std::__cxx11::string::_M_assign((string *)&(ptVar13->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_5d0,ptVar13);
  VW::config::option_group_definition::add<float>(&new_options,&local_5d0);
  VW::config::typed_option<float>::~typed_option(&local_5d0);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_fd0);
  std::__cxx11::string::string((string *)&local_ff0,"search_total_nb_policies",local_1498);
  location_01 = &psVar2->total_number_of_policies;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&__msg,&local_ff0,location_01);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "if we are going to train the policies through multiple separate calls to vw, we need to specify this parameter and tell vw how many policies are eventually going to be trained"
             ,local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_670,(typed_option<unsigned_int> *)&__msg);
  VW::config::option_group_definition::add<unsigned_int>(&new_options,&local_670);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_670);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::__cxx11::string::string((string *)&local_1010,"search_trained_nb_policies",local_1498);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&__msg,&local_1010,&search_trained_nb_policies);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,"the number of trained policies in a file",local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_710,(typed_option<unsigned_int> *)&__msg);
  VW::config::option_group_definition::add<unsigned_int>(&new_options,&local_710);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_710);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_1010);
  std::__cxx11::string::string((string *)&local_1030,"search_allowed_transitions",local_1498);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_1030,&search_allowed_transitions);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "read file of allowed transitions [def: all transitions are allowed]",local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_7b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&new_options,&local_7b0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_7b0);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_1030);
  std::__cxx11::string::string((string *)&local_1050,"search_subsample_time",local_1498);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_1050,&psVar2->subsample_timesteps);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "instead of training at all timesteps, use a subset. if value in (0,1), train on a random v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"
             ,local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<float>::typed_option(&local_850,(typed_option<float> *)&__msg);
  VW::config::option_group_definition::add<float>(&new_options,&local_850);
  VW::config::typed_option<float>::~typed_option(&local_850);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_1050);
  std::__cxx11::string::string((string *)&local_1070,"search_neighbor_features",local_1498);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_1070,&neighbor_features_string);
  local_13d0 = true;
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "copy features from neighboring lines. argument looks like: \'-1:a,+2\' meaning copy previous line namespace a and next next line from namespace _unnamed_, where \',\' separates them"
             ,local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_8f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&new_options,&local_8f0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_8f0);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_1070);
  std::__cxx11::string::string((string *)&local_1090,"search_rollout_num_steps",local_1498);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_1090,&psVar2->rollout_num_steps);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "how many calls of \"loss\" before we stop really predicting on rollouts and switch to oracle (default means \"infinite\")"
             ,local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_990,(typed_option<unsigned_long> *)&__msg);
  VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_990);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_990);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_1090);
  std::__cxx11::string::string((string *)&local_10b0,"search_history_length",local_1498);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_10b0,&psVar2->history_length);
  local_13d0 = true;
  ptVar12 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)&__msg,1);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "some tasks allow you to specify how much history their depend on; specify that here",
             local_1478);
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_a30,ptVar12);
  VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_a30);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_a30);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_10b0);
  std::__cxx11::string::string((string *)&local_10d0,"search_no_caching",local_1498);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_10d0,&psVar2->no_caching);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "turn off the built-in caching ability (makes things slower, but technically more safe)"
             ,local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<bool>::typed_option(&local_ad0,(typed_option<bool> *)&__msg);
  VW::config::option_group_definition::add<bool>(&new_options,&local_ad0);
  VW::config::typed_option<bool>::~typed_option(&local_ad0);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_10d0);
  std::__cxx11::string::string((string *)&local_10f0,"search_xv",local_1498);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)&__msg,&local_10f0,&psVar2->xv)
  ;
  std::__cxx11::string::string
            ((string *)&sStack_14c8,"train two separate policies, alternating prediction/learning",
             local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<bool>::typed_option(&local_b70,(typed_option<bool> *)&__msg);
  VW::config::option_group_definition::add<bool>(&new_options,&local_b70);
  VW::config::typed_option<bool>::~typed_option(&local_b70);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_10f0);
  std::__cxx11::string::string((string *)&local_1110,"search_perturb_oracle",local_1498);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_1110,&psVar2->perturb_oracle);
  ptVar13 = VW::config::typed_option<float>::default_value((typed_option<float> *)&__msg,0.0);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,"perturb the oracle on rollin with this probability",local_1478)
  ;
  std::__cxx11::string::_M_assign((string *)&(ptVar13->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_c10,ptVar13);
  VW::config::option_group_definition::add<float>(&new_options,&local_c10);
  VW::config::typed_option<float>::~typed_option(&local_c10);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_1110);
  std::__cxx11::string::string((string *)&local_1130,"search_linear_ordering",local_1498);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_1130,&psVar2->linear_ordering);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "insist on generating examples in linear order (def: hoopla permutation)",local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<bool>::typed_option(&local_cb0,(typed_option<bool> *)&__msg);
  VW::config::option_group_definition::add<bool>(&new_options,&local_cb0);
  VW::config::typed_option<bool>::~typed_option(&local_cb0);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_1130);
  std::__cxx11::string::string((string *)&local_1150,"search_active_verify",local_1498);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_1150,&psVar2->active_csoaa_verify);
  std::__cxx11::string::string
            ((string *)&sStack_14c8,
             "verify that active learning is doing the right thing (arg = multiplier, should be = cost_range * range_c)"
             ,local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<float>::typed_option(&local_d50,(typed_option<float> *)&__msg);
  VW::config::option_group_definition::add<float>(&new_options,&local_d50);
  VW::config::typed_option<float>::~typed_option(&local_d50);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_1150);
  std::__cxx11::string::string((string *)&local_1170,"search_save_every_k_runs",local_1498);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_1170,&psVar2->save_every_k_runs);
  std::__cxx11::string::string((string *)&sStack_14c8,"save model every k runs",local_1478);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x20));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_df0,(typed_option<unsigned_long> *)&__msg);
  VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_df0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_df0);
  std::__cxx11::string::~string((string *)&sStack_14c8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_1170);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&__msg,"search_task",(allocator *)&sStack_14c8);
  iVar10 = (*options->_vptr_options_i[1])(options,&__msg);
  if ((char)iVar10 == '\0') {
    std::__cxx11::string::~string((string *)&__msg);
  }
  else {
    bVar9 = std::operator==(&task_string,"hook");
    std::__cxx11::string::~string((string *)&__msg);
    if (!bVar9) {
      search_initialize(local_14a8,
                        sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_Search::search_*,_false>._M_head_impl);
      parse_neighbor_features
                (&neighbor_features_string,
                 sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_Search::search_*,_false>._M_head_impl);
      iVar10 = std::__cxx11::string::compare((char *)&interpolation_string);
      if (iVar10 == 0) {
        psVar2->allow_current_policy = true;
        psVar2->adaptive_beta = true;
        psVar2->passes_per_policy = local_14a8->numpasses;
        if (1 < psVar2->current_policy) {
          psVar2->current_policy = 1;
        }
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)&interpolation_string);
        if (iVar10 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          std::operator<<((ostream *)local_1430,
                          "error: --search_interpolation must be \'data\' or \'policy\'");
          pvVar14 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar14,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xac6,&local_e10);
          __cxa_throw(pvVar14,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
      iVar10 = std::__cxx11::string::compare((char *)&rollout_string);
      if ((iVar10 == 0) ||
         (iVar10 = std::__cxx11::string::compare((char *)&rollout_string), iVar10 == 0)) {
        psVar2->rollout_method = POLICY;
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)&rollout_string);
        if ((iVar10 == 0) ||
           (iVar10 = std::__cxx11::string::compare((char *)&rollout_string), iVar10 == 0)) {
          psVar2->rollout_method = ORACLE;
        }
        else {
          iVar10 = std::__cxx11::string::compare((char *)&rollout_string);
          if (iVar10 == 0) {
            psVar2->rollout_method = MIX_PER_STATE;
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)&rollout_string);
            if ((iVar10 == 0) ||
               (iVar10 = std::__cxx11::string::compare((char *)&rollout_string), iVar10 == 0)) {
              psVar2->rollout_method = MIX_PER_ROLL;
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)&rollout_string);
              if (iVar10 != 0) {
                std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
                std::operator<<((ostream *)local_1430,
                                "error: --search_rollout must be \'learn\', \'ref\', \'mix\', \'mix_per_state\' or \'none\'"
                               );
                pvVar14 = (vw_exception *)__cxa_allocate_exception(0x38);
                std::__cxx11::stringbuf::str();
                VW::vw_exception::vw_exception
                          (pvVar14,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                           ,0xad6,&local_e30);
                __cxa_throw(pvVar14,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
              }
              psVar2->rollout_method = NO_ROLLOUT;
              psVar2->no_caching = true;
            }
          }
        }
      }
      iVar10 = std::__cxx11::string::compare((char *)&rollin_string);
      RVar24 = POLICY;
      if ((iVar10 != 0) &&
         (iVar10 = std::__cxx11::string::compare((char *)&rollin_string), iVar10 != 0)) {
        iVar10 = std::__cxx11::string::compare((char *)&rollin_string);
        RVar24 = ORACLE;
        if ((iVar10 != 0) &&
           (iVar10 = std::__cxx11::string::compare((char *)&rollin_string), iVar10 != 0)) {
          iVar10 = std::__cxx11::string::compare((char *)&rollin_string);
          if (iVar10 == 0) {
            RVar24 = MIX_PER_STATE;
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)&rollin_string);
            RVar24 = MIX_PER_ROLL;
            if ((iVar10 != 0) &&
               (iVar10 = std::__cxx11::string::compare((char *)&rollin_string), iVar10 != 0)) {
              std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
              std::operator<<((ostream *)local_1430,
                              "error: --search_rollin must be \'learn\', \'ref\', \'mix\' or \'mix_per_state\'"
                             );
              pvVar14 = (vw_exception *)__cxa_allocate_exception(0x38);
              std::__cxx11::stringbuf::str();
              VW::vw_exception::vw_exception
                        (pvVar14,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                         ,0xae1,&local_e50);
              __cxa_throw(pvVar14,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
            }
          }
        }
      }
      psVar2->rollin_method = RVar24;
      ppVar15 = calloc_or_throw<polylabel>();
      psVar2->allowed_actions_cache = ppVar15;
      std::__cxx11::string::string((string *)&__msg,"cb",(allocator *)&sStack_14c8);
      iVar10 = (*options->_vptr_options_i[1])(options,&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      psVar2->cb_learner = SUB41(iVar10,0);
      if (SUB41(iVar10,0) == false) {
        ppuVar16 = &COST_SENSITIVE::cs_label;
      }
      else {
        ppuVar16 = &CB::cb_label;
      }
      (*(code *)*ppuVar16)(psVar2->allowed_actions_cache);
      (psVar2->learn_losses).cs.costs.end_array = (wclass *)0x0;
      (psVar2->learn_losses).cs.costs.erase_count = 0;
      (psVar2->learn_losses).cs.costs._begin = (wclass *)0x0;
      (psVar2->learn_losses).cs.costs._end = (wclass *)0x0;
      (psVar2->gte_label).cs.costs._begin = (wclass *)0x0;
      (psVar2->gte_label).cs.costs._end = (wclass *)0x0;
      (psVar2->gte_label).cs.costs.end_array = (wclass *)0x0;
      (psVar2->gte_label).cs.costs.erase_count = 0;
      ensure_param(&psVar2->beta,0.0,1.0,0.5,
                   "warning: search_beta must be in (0,1); resetting to 0.5");
      ensure_param(&psVar2->alpha,0.0,1.0,1e-10,
                   "warning: search_alpha must be in (0,1); resetting to 1e-10");
      psVar2->num_calls_to_run = 0;
      uVar1 = psVar2->current_policy;
      uVar11 = uVar1;
      if (local_14a8->training == true) {
        fVar27 = ceilf((float)local_14a8->numpasses / (float)*location_00);
        uVar11 = (int)fVar27 + uVar1;
      }
      if ((*location_01 < uVar11) && (*location_01 = uVar11, uVar1 != 0)) {
        poVar17 = std::operator<<((ostream *)&std::cerr,
                                  "warning: you\'re attempting to train more classifiers than was allocated initially. Likely to cause bad performance."
                                 );
        std::endl<char,std::char_traits<char>>(poVar17);
      }
      if ((local_14a8->training == false) && (psVar2->current_policy != 0)) {
        psVar2->current_policy = psVar2->current_policy - 1;
      }
      poVar3 = local_14a8->options;
      std::__cxx11::string::string((string *)&__msg,"search_trained_nb_policies",local_1498);
      std::__cxx11::to_string(&sStack_14c8,psVar2->current_policy);
      (*poVar3->_vptr_options_i[6])(poVar3,&__msg,&sStack_14c8);
      std::__cxx11::string::~string((string *)&sStack_14c8);
      std::__cxx11::string::~string((string *)&__msg);
      poVar3 = local_14a8->options;
      std::__cxx11::string::string
                ((string *)&__msg,"search_trained_nb_policies",(allocator *)&sStack_14c8);
      ptVar18 = VW::config::options_i::get_typed_option<unsigned_int>(poVar3,(string *)&__msg);
      VW::config::typed_option<unsigned_int>::value(ptVar18,psVar2->current_policy);
      std::__cxx11::string::~string((string *)&__msg);
      poVar3 = local_14a8->options;
      std::__cxx11::string::string((string *)&__msg,"search_total_nb_policies",local_1498);
      std::__cxx11::to_string(&sStack_14c8,*location_01);
      (*poVar3->_vptr_options_i[6])(poVar3,&__msg,&sStack_14c8);
      std::__cxx11::string::~string((string *)&sStack_14c8);
      std::__cxx11::string::~string((string *)&__msg);
      poVar3 = local_14a8->options;
      std::__cxx11::string::string
                ((string *)&__msg,"search_total_nb_policies",(allocator *)&sStack_14c8);
      ptVar18 = VW::config::options_i::get_typed_option<unsigned_int>(poVar3,(string *)&__msg);
      VW::config::typed_option<unsigned_int>::value(ptVar18,*location_01);
      std::__cxx11::string::~string((string *)&__msg);
      iVar10 = std::__cxx11::string::compare((char *)&task_string);
      if (iVar10 == 0) {
        poVar17 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        poVar17 = std::operator<<(poVar17,"available search tasks:");
        std::endl<char,std::char_traits<char>>(poVar17);
        for (ppuVar16 = &all_tasks; *ppuVar16 != (undefined *)0x0; ppuVar16 = ppuVar16 + 1) {
          poVar17 = std::operator<<((ostream *)&std::cerr,"  ");
          poVar17 = std::operator<<(poVar17,*(char **)*ppuVar16);
          std::endl<char,std::char_traits<char>>(poVar17);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_00219a0f:
        exit(0);
      }
      iVar10 = std::__cxx11::string::compare((char *)&metatask_string);
      if (iVar10 == 0) {
        poVar17 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        poVar17 = std::operator<<(poVar17,"available search metatasks:");
        std::endl<char,std::char_traits<char>>(poVar17);
        for (ppuVar16 = &all_metatasks; *ppuVar16 != (undefined *)0x0; ppuVar16 = ppuVar16 + 1) {
          poVar17 = std::operator<<((ostream *)&std::cerr,"  ");
          poVar17 = std::operator<<(poVar17,*(char **)*ppuVar16);
          std::endl<char,std::char_traits<char>>(poVar17);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_00219a0f;
      }
      for (ppuVar16 = &all_tasks; *ppuVar16 != (undefined *)0x0; ppuVar16 = ppuVar16 + 1) {
        iVar10 = std::__cxx11::string::compare((char *)&task_string);
        if (iVar10 == 0) {
          psVar4 = (search_task *)*ppuVar16;
          psVar2->task = psVar4;
          (sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_Search::search_*,_false>._M_head_impl)->task_name =
               psVar4->task_name;
          break;
        }
      }
      if (psVar2->task == (search_task *)0x0) {
        std::__cxx11::string::string((string *)&__msg,"help",(allocator *)&sStack_14c8);
        iVar10 = (*options->_vptr_options_i[1])(options,&__msg);
        std::__cxx11::string::~string((string *)&__msg);
        if ((char)iVar10 == '\0') {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          poVar17 = std::operator<<((ostream *)local_1430,"fail: unknown task for --search_task \'")
          ;
          poVar17 = std::operator<<(poVar17,(string *)&task_string);
          std::operator<<(poVar17,"\'; use --search_task list to get a list");
          pvVar14 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar14,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xb36,&local_e70);
          __cxa_throw(pvVar14,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
      psVar2->metatask = (search_metatask *)0x0;
      for (ppuVar16 = &all_metatasks; *ppuVar16 != (undefined *)0x0; ppuVar16 = ppuVar16 + 1) {
        iVar10 = std::__cxx11::string::compare((char *)&metatask_string);
        if (iVar10 == 0) {
          psVar5 = (search_metatask *)*ppuVar16;
          psVar2->metatask = psVar5;
          (sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_Search::search_*,_false>._M_head_impl)->metatask_name =
               psVar5->metatask_name;
          break;
        }
      }
      local_14a8->p->emptylines_separate_examples = true;
      std::__cxx11::string::string((string *)&__msg,"csoaa",&local_1499);
      iVar10 = (*options->_vptr_options_i[1])(options,&__msg);
      if ((char)iVar10 == '\0') {
        std::__cxx11::string::string((string *)&sStack_14c8,"cs_active",&local_149a);
        iVar10 = (*options->_vptr_options_i[1])(options,&sStack_14c8);
        if ((char)iVar10 != '\0') {
LAB_0021948e:
          std::__cxx11::string::~string((string *)&sStack_14c8);
          goto LAB_00219496;
        }
        std::__cxx11::string::string((string *)local_1498,"csoaa_ldf",&local_149b);
        iVar10 = (*options->_vptr_options_i[1])(options,local_1498);
        if ((char)iVar10 != '\0') {
          std::__cxx11::string::~string((string *)local_1498);
          goto LAB_0021948e;
        }
        std::__cxx11::string::string((string *)local_1478,"wap_ldf",&local_149c);
        iVar10 = (*options->_vptr_options_i[1])(options,local_1478);
        if ((char)iVar10 == '\0') {
          std::__cxx11::string::string(local_1190,"cb",&local_149d);
          iVar10 = (*options->_vptr_options_i[1])(options,local_1190);
          bVar25 = (byte)iVar10 ^ 1;
          std::__cxx11::string::~string(local_1190);
        }
        else {
          bVar25 = 0;
        }
        std::__cxx11::string::~string((string *)local_1478);
        std::__cxx11::string::~string((string *)local_1498);
        std::__cxx11::string::~string((string *)&sStack_14c8);
        std::__cxx11::string::~string((string *)&__msg);
        if (bVar25 != 0) {
          std::__cxx11::string::string((string *)&__msg,"csoaa",local_1498);
          std::__cxx11::to_string(&sStack_14c8,*location);
          (*options->_vptr_options_i[5])(options,&__msg,&sStack_14c8);
          goto LAB_0021948e;
        }
      }
      else {
LAB_00219496:
        std::__cxx11::string::~string((string *)&__msg);
      }
      std::__cxx11::string::string((string *)&__msg,"cs_active",(allocator *)&sStack_14c8);
      iVar10 = (*options->_vptr_options_i[1])(options,&__msg);
      psVar2->active_csoaa = SUB41(iVar10,0);
      std::__cxx11::string::~string((string *)&__msg);
      psVar2->active_csoaa_verify = -1.0;
      std::__cxx11::string::string
                ((string *)&__msg,"search_active_verify",(allocator *)&sStack_14c8);
      iVar10 = (*options->_vptr_options_i[1])(options,&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if (((char)iVar10 != '\0') && (psVar2->active_csoaa == false)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<((ostream *)local_1430,
                        "cannot use --search_active_verify without using --cs_active");
        pvVar14 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar14,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                   ,0xb4c,&local_e90);
        __cxa_throw(pvVar14,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      base = setup_base(local_14a8->options,local_14a8);
      ppuVar16 = &MULTICLASS::mc_label;
      plVar23 = &local_14a8->p->lp;
      for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
        plVar23->default_label = (_func_void_void_ptr *)*ppuVar16;
        ppuVar16 = ppuVar16 + (ulong)bVar26 * -2 + 1;
        plVar23 = (label_parser *)((long)plVar23 + (ulong)bVar26 * -0x10 + 8);
      }
      local_14a8->label_type = mc;
      if ((psVar2->task != (search_task *)0x0) &&
         (p_Var6 = psVar2->task->initialize,
         p_Var6 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
        (*p_Var6)(sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_Search::search_*,_false>._M_head_impl,location,options);
      }
      if ((psVar2->metatask != (search_metatask *)0x0) &&
         (p_Var6 = psVar2->metatask->initialize,
         p_Var6 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
        (*p_Var6)(sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_Search::search_*,_false>._M_head_impl,location,options);
      }
      psVar2->meta_t = 0;
      std::__cxx11::string::string
                ((string *)&__msg,"search_allowed_transitions",(allocator *)&sStack_14c8);
      iVar10 = (*options->_vptr_options_i[1])(options,&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if ((char)iVar10 != '\0') {
        read_allowed_transitions
                  ((v_array<COST_SENSITIVE::label> *)&__msg,(action)*location,
                   search_allowed_transitions._M_dataplus._M_p);
      }
      handle_condition_options(local_14a8,&psVar2->acset);
      if (psVar2->allow_current_policy == false) {
        local_14a8->check_holdout_every_n_passes = *location_00;
      }
      local_14a8->searchstr = &sch;
      cVar19 = clock();
      psVar2->start_clock_time = cVar19;
      sVar20 = psVar2->num_learners;
      if (psVar2->xv == true) {
        sVar20 = sVar20 * 3;
        psVar2->num_learners = sVar20;
      }
      plVar21 = LEARNER::
                init_learner<Search::search,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,char>>
                          (&sch,base,do_actual_learning<true>,do_actual_learning<false>,
                           *location_01 * sVar20);
      uVar7 = *(undefined8 *)(plVar21 + 0x18);
      uVar8 = *(undefined8 *)(plVar21 + 0x20);
      *(undefined8 *)(plVar21 + 0x58) = uVar7;
      *(code **)(plVar21 + 0x68) = finish_multiline_example;
      *(undefined8 *)(plVar21 + 0xa0) = uVar7;
      *(undefined8 *)(plVar21 + 0xa8) = uVar8;
      *(code **)(plVar21 + 0xb0) = end_examples;
      *(undefined8 *)(plVar21 + 0xb8) = uVar7;
      *(undefined8 *)(plVar21 + 0xc0) = uVar8;
      *(code **)(plVar21 + 200) = search_finish;
      *(undefined8 *)(plVar21 + 0x88) = uVar7;
      *(undefined8 *)(plVar21 + 0x90) = uVar8;
      *(code **)(plVar21 + 0x98) = end_pass;
      goto LAB_0021970e;
    }
  }
  plVar21 = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
LAB_0021970e:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&search_allowed_transitions);
  std::__cxx11::string::~string((string *)&rollin_string);
  std::__cxx11::string::~string((string *)&rollout_string);
  std::__cxx11::string::~string((string *)&neighbor_features_string);
  std::__cxx11::string::~string((string *)&interpolation_string);
  std::__cxx11::string::~string((string *)&metatask_string);
  std::__cxx11::string::~string((string *)&task_string);
  std::unique_ptr<Search::search,_void_(*)(void_*)>::~unique_ptr(&sch);
  return (base_learner *)plVar21;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  free_ptr<search> sch = scoped_calloc_or_throw<search>();
  search_private& priv = *sch->priv;
  std::string task_string;
  std::string metatask_string;
  std::string interpolation_string = "data";
  std::string neighbor_features_string;
  std::string rollout_string = "mix_per_state";
  std::string rollin_string = "mix_per_state";

  uint32_t search_trained_nb_policies;
  std::string search_allowed_transitions;

  priv.A = 1;
  option_group_definition new_options("Search options");
  new_options.add(
      make_option("search", priv.A).keep().help("Use learning to search, argument=maximum action id or 0 for LDF"));
  new_options.add(make_option("search_task", task_string)
                      .keep()
                      .help("the search task (use \"--search_task list\" to get a list of available tasks)"));
  new_options.add(
      make_option("search_metatask", metatask_string)
          .keep()
          .help("the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"));
  new_options.add(make_option("search_interpolation", interpolation_string)
                      .keep()
                      .help("at what level should interpolation happen? [*data|policy]"));
  new_options.add(
      make_option("search_rollout", rollout_string)
          .help("how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"));
  new_options.add(make_option("search_rollin", rollin_string)
                      .help("how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"));
  new_options.add(make_option("search_passes_per_policy", priv.passes_per_policy)
                      .default_value(1)
                      .help("number of passes per policy (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_beta", priv.beta)
                      .default_value(0.5f)
                      .help("interpolation rate for policies (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_alpha", priv.alpha)
                      .default_value(1e-10f)
                      .help("annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)"));
  new_options.add(make_option("search_total_nb_policies", priv.total_number_of_policies)
                      .help("if we are going to train the policies through multiple separate calls to vw, we need to "
                            "specify this parameter and tell vw how many policies are eventually going to be trained"));
  new_options.add(make_option("search_trained_nb_policies", search_trained_nb_policies)
                      .help("the number of trained policies in a file"));
  new_options.add(make_option("search_allowed_transitions", search_allowed_transitions)
                      .help("read file of allowed transitions [def: all transitions are allowed]"));
  new_options.add(make_option("search_subsample_time", priv.subsample_timesteps)
                      .help("instead of training at all timesteps, use a subset. if value in (0,1), train on a random "
                            "v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"));
  new_options.add(
      make_option("search_neighbor_features", neighbor_features_string)
          .keep()
          .help("copy features from neighboring lines. argument looks like: '-1:a,+2' meaning copy previous line "
                "namespace a and next next line from namespace _unnamed_, where ',' separates them"));
  new_options.add(make_option("search_rollout_num_steps", priv.rollout_num_steps)
                      .help("how many calls of \"loss\" before we stop really predicting on rollouts and switch to "
                            "oracle (default means \"infinite\")"));
  new_options.add(make_option("search_history_length", priv.history_length)
                      .keep()
                      .default_value(1)
                      .help("some tasks allow you to specify how much history their depend on; specify that here"));
  new_options.add(make_option("search_no_caching", priv.no_caching)
                      .help("turn off the built-in caching ability (makes things slower, but technically more safe)"));
  new_options.add(
      make_option("search_xv", priv.xv).help("train two separate policies, alternating prediction/learning"));
  new_options.add(make_option("search_perturb_oracle", priv.perturb_oracle)
                      .default_value(0.f)
                      .help("perturb the oracle on rollin with this probability"));
  new_options.add(make_option("search_linear_ordering", priv.linear_ordering)
                      .help("insist on generating examples in linear order (def: hoopla permutation)"));
  new_options.add(make_option("search_active_verify", priv.active_csoaa_verify)
                      .help("verify that active learning is doing the right thing (arg = multiplier, should be = "
                            "cost_range * range_c)"));
  new_options.add(make_option("search_save_every_k_runs", priv.save_every_k_runs).help("save model every k runs"));
  options.add_and_parse(new_options);

  // If hook was passed as the search_task then do not activate reduction. This task can only be used in library form.
  if (!options.was_supplied("search_task") || task_string == "hook")
    return nullptr;

  search_initialize(&all, *sch.get());

  parse_neighbor_features(neighbor_features_string, *sch.get());

  if (interpolation_string.compare("data") == 0)  // run as dagger
  {
    priv.adaptive_beta = true;
    priv.allow_current_policy = true;
    priv.passes_per_policy = all.numpasses;
    if (priv.current_policy > 1)
      priv.current_policy = 1;
  }
  else if (interpolation_string.compare("policy") == 0)
    ;
  else
    THROW("error: --search_interpolation must be 'data' or 'policy'");

  if ((rollout_string.compare("policy") == 0) || (rollout_string.compare("learn") == 0))
    priv.rollout_method = POLICY;
  else if ((rollout_string.compare("oracle") == 0) || (rollout_string.compare("ref") == 0))
    priv.rollout_method = ORACLE;
  else if ((rollout_string.compare("mix_per_state") == 0))
    priv.rollout_method = MIX_PER_STATE;
  else if ((rollout_string.compare("mix_per_roll") == 0) || (rollout_string.compare("mix") == 0))
    priv.rollout_method = MIX_PER_ROLL;
  else if ((rollout_string.compare("none") == 0))
  {
    priv.rollout_method = NO_ROLLOUT;
    priv.no_caching = true;
  }
  else
    THROW("error: --search_rollout must be 'learn', 'ref', 'mix', 'mix_per_state' or 'none'");

  if ((rollin_string.compare("policy") == 0) || (rollin_string.compare("learn") == 0))
    priv.rollin_method = POLICY;
  else if ((rollin_string.compare("oracle") == 0) || (rollin_string.compare("ref") == 0))
    priv.rollin_method = ORACLE;
  else if ((rollin_string.compare("mix_per_state") == 0))
    priv.rollin_method = MIX_PER_STATE;
  else if ((rollin_string.compare("mix_per_roll") == 0) || (rollin_string.compare("mix") == 0))
    priv.rollin_method = MIX_PER_ROLL;
  else
    THROW("error: --search_rollin must be 'learn', 'ref', 'mix' or 'mix_per_state'");

  // check if the base learner is contextual bandit, in which case, we dont rollout all actions.
  priv.allowed_actions_cache = &calloc_or_throw<polylabel>();
  if (options.was_supplied("cb"))
  {
    priv.cb_learner = true;
    CB::cb_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cb.costs = v_init<CB::cb_class>();
    priv.gte_label.cb.costs = v_init<CB::cb_class>();
  }
  else
  {
    priv.cb_learner = false;
    CS::cs_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cs.costs = v_init<CS::wclass>();
    priv.gte_label.cs.costs = v_init<CS::wclass>();
  }

  ensure_param(priv.beta, 0.0, 1.0, 0.5, "warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(priv.alpha, 0.0, 1.0, 1e-10f, "warning: search_alpha must be in (0,1); resetting to 1e-10");

  priv.num_calls_to_run = 0;

  // compute total number of policies we will have at end of training
  // we add current_policy for cases where we start from an initial set of policies loaded through -i option
  uint32_t tmp_number_of_policies = priv.current_policy;
  if (all.training)
    tmp_number_of_policies += (int)ceil(((float)all.numpasses) / ((float)priv.passes_per_policy));

  // the user might have specified the number of policies that will eventually be trained through multiple vw calls,
  // so only set total_number_of_policies to computed value if it is larger
  cdbg << "current_policy=" << priv.current_policy << " tmp_number_of_policies=" << tmp_number_of_policies
       << " total_number_of_policies=" << priv.total_number_of_policies << endl;
  if (tmp_number_of_policies > priv.total_number_of_policies)
  {
    priv.total_number_of_policies = tmp_number_of_policies;
    if (priv.current_policy >
        0)  // we loaded a file but total number of policies didn't match what is needed for training
      std::cerr << "warning: you're attempting to train more classifiers than was allocated initially. Likely to cause "
                   "bad performance."
                << endl;
  }

  // current policy currently points to a new policy we would train
  // if we are not training and loaded a bunch of policies for testing, we need to subtract 1 from current policy
  // so that we only use those loaded when testing (as run_prediction is called with allow_current to true)
  if (!all.training && priv.current_policy > 0)
    priv.current_policy--;

  all.options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
  all.options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);

  all.options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
  all.options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);

  cdbg << "search current_policy = " << priv.current_policy
       << " total_number_of_policies = " << priv.total_number_of_policies << endl;

  if (task_string.compare("list") == 0)
  {
    std::cerr << endl << "available search tasks:" << endl;
    for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->task_name << endl;
    std::cerr << endl;
    exit(0);
  }
  if (metatask_string.compare("list") == 0)
  {
    std::cerr << endl << "available search metatasks:" << endl;
    for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->metatask_name << endl;
    std::cerr << endl;
    exit(0);
  }
  for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
    if (task_string.compare((*mytask)->task_name) == 0)
    {
      priv.task = *mytask;
      sch->task_name = (*mytask)->task_name;
      break;
    }
  if (priv.task == nullptr)
  {
    if (!options.was_supplied("help"))
      THROW("fail: unknown task for --search_task '" << task_string << "'; use --search_task list to get a list");
  }
  priv.metatask = nullptr;
  for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
    if (metatask_string.compare((*mytask)->metatask_name) == 0)
    {
      priv.metatask = *mytask;
      sch->metatask_name = (*mytask)->metatask_name;
      break;
    }
  all.p->emptylines_separate_examples = true;

  if (!options.was_supplied("csoaa") && !options.was_supplied("cs_active") && !options.was_supplied("csoaa_ldf") &&
      !options.was_supplied("wap_ldf") && !options.was_supplied("cb"))
  {
    options.insert("csoaa", std::to_string(priv.A));
  }

  priv.active_csoaa = options.was_supplied("cs_active");
  priv.active_csoaa_verify = -1.;
  if (options.was_supplied("search_active_verify"))
    if (!priv.active_csoaa)
      THROW("cannot use --search_active_verify without using --cs_active");

  cdbg << "active_csoaa = " << priv.active_csoaa << ", active_csoaa_verify = " << priv.active_csoaa_verify << endl;

  base_learner* base = setup_base(*all.options, all);

  // default to OAA labels unless the task wants to override this (which they can do in initialize)
  all.p->lp = MC::mc_label;
  all.label_type = label_type::mc;
  if (priv.task && priv.task->initialize)
    priv.task->initialize(*sch.get(), priv.A, options);
  if (priv.metatask && priv.metatask->initialize)
    priv.metatask->initialize(*sch.get(), priv.A, options);
  priv.meta_t = 0;

  if (options.was_supplied("search_allowed_transitions"))
    read_allowed_transitions((action)priv.A, search_allowed_transitions.c_str());

  // set up auto-history (used to only do this if AUTO_CONDITION_FEATURES was on, but that doesn't work for hooktask)
  handle_condition_options(all, priv.acset);

  if (!priv.allow_current_policy)  // if we're not dagger
    all.check_holdout_every_n_passes = priv.passes_per_policy;

  all.searchstr = &sch;

  priv.start_clock_time = clock();

  if (priv.xv)
    priv.num_learners *= 3;

  cdbg << "num_learners = " << priv.num_learners << endl;

  learner<search, multi_ex>& l = init_learner(sch, make_base(*base), do_actual_learning<true>,
      do_actual_learning<false>, priv.total_number_of_policies * priv.num_learners);
  l.set_finish_example(finish_multiline_example);
  l.set_end_examples(end_examples);
  l.set_finish(search_finish);
  l.set_end_pass(end_pass);
  return make_base(l);
}